

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.cpp
# Opt level: O1

int qt_gl_resolve_extensions(void)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  QOpenGLContext *this;
  Node<QByteArray,_QHashDummyValue> *pNVar4;
  pair<int,_int> pVar5;
  QOpenGLFunctions *pQVar6;
  uint uVar7;
  uint uVar8;
  long in_FS_OFFSET;
  bool bVar9;
  bool bVar10;
  GLboolean srgbCapableFramebuffers;
  QSurfaceFormat format;
  QOpenGLExtensionMatcher extensionMatcher;
  QByteArray local_d8;
  QByteArray local_c0;
  QByteArray local_a8;
  QByteArray local_90;
  QByteArray local_78;
  QByteArray local_60;
  undefined1 local_48 [8];
  QHash<QByteArray,_QHashDummyValue> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QOpenGLExtensionMatcher::QOpenGLExtensionMatcher((QOpenGLExtensionMatcher *)&local_40);
  this = QOpenGLContext::currentContext();
  local_48 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QOpenGLContext::format((QOpenGLContext *)local_48);
  QByteArray::QByteArray(&local_60,"GL_EXT_bgra",-1);
  if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    uVar7 = 0;
  }
  else {
    pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_40.d,&local_60);
    uVar7 = (uint)(pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0) << 0xb;
  }
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
    }
  }
  QByteArray::QByteArray(&local_60,"GL_ARB_texture_rectangle",-1);
  if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    uVar8 = 0;
  }
  else {
    pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_40.d,&local_60);
    uVar8 = (uint)(pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0);
  }
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
    }
  }
  QByteArray::QByteArray(&local_60,"GL_ARB_texture_compression",-1);
  if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_40.d,&local_60);
    bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
    }
  }
  uVar1 = uVar8 | uVar7 | 4;
  if (!bVar9) {
    uVar1 = uVar8 | uVar7;
  }
  QByteArray::QByteArray(&local_60,"GL_EXT_texture_compression_s3tc",-1);
  if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_40.d,&local_60);
    bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
    }
  }
  uVar7 = uVar1 + 0x1000;
  if (!bVar9) {
    uVar7 = uVar1;
  }
  QByteArray::QByteArray(&local_60,"GL_OES_compressed_ETC1_RGB8_texture",-1);
  if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_40.d,&local_60);
    bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
    }
  }
  uVar8 = uVar7 + 0x2000;
  if (!bVar9) {
    uVar8 = uVar7;
  }
  QByteArray::QByteArray(&local_60,"GL_IMG_texture_compression_pvrtc",-1);
  if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_40.d,&local_60);
    bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
    }
  }
  uVar7 = uVar8 + 0x4000;
  if (!bVar9) {
    uVar7 = uVar8;
  }
  QByteArray::QByteArray(&local_60,"GL_KHR_texture_compression_astc_ldr",-1);
  if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_40.d,&local_60);
    bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
    }
  }
  uVar8 = uVar7 + 0x4000000;
  if (!bVar9) {
    uVar8 = uVar7;
  }
  QByteArray::QByteArray(&local_60,"GL_ARB_texture_mirrored_repeat",-1);
  if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_40.d,&local_60);
    bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
    }
  }
  uVar7 = uVar8 | 8;
  if (!bVar9) {
    uVar7 = uVar8;
  }
  QByteArray::QByteArray(&local_60,"GL_EXT_stencil_two_side",-1);
  if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_40.d,&local_60);
    bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
    }
  }
  uVar8 = uVar7 | 0x20;
  if (!bVar9) {
    uVar8 = uVar7;
  }
  QByteArray::QByteArray(&local_60,"GL_EXT_stencil_wrap",-1);
  if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_40.d,&local_60);
    bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
    }
  }
  uVar7 = uVar8 | 0x40;
  if (!bVar9) {
    uVar7 = uVar8;
  }
  QByteArray::QByteArray(&local_60,"GL_NV_float_buffer",-1);
  if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_40.d,&local_60);
    bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
    }
  }
  uVar8 = uVar7 | 0x100;
  if (!bVar9) {
    uVar8 = uVar7;
  }
  QByteArray::QByteArray(&local_60,"GL_ARB_pixel_buffer_object",-1);
  if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_40.d,&local_60);
    bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
    }
  }
  uVar7 = uVar8 | 0x200;
  if (!bVar9) {
    uVar7 = uVar8;
  }
  QByteArray::QByteArray(&local_60,"GL_ARB_texture_swizzle",-1);
  if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_40.d,&local_60);
    bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  bVar10 = true;
  if (!bVar9) {
    QByteArray::QByteArray(&local_78,"GL_EXT_texture_swizzle",-1);
    if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar10 = false;
    }
    else {
      pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_40.d,&local_78);
      bVar10 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
  }
  if ((!bVar9) && (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0)) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
    }
  }
  uVar8 = uVar7 | 0x1000000;
  if (!bVar10) {
    uVar8 = uVar7;
  }
  QByteArray::QByteArray(&local_60,"GL_OES_standard_derivatives",-1);
  if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_40.d,&local_60);
    bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
    }
  }
  uVar7 = uVar8 | 0x2000000;
  if (!bVar9) {
    uVar7 = uVar8;
  }
  QByteArray::QByteArray(&local_60,"GL_ARB_half_float_vertex",-1);
  if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_40.d,&local_60);
    bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
    }
  }
  uVar8 = uVar7 + 0x10000000;
  if (!bVar9) {
    uVar8 = uVar7;
  }
  QByteArray::QByteArray(&local_60,"GL_OVR_multiview",-1);
  if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_40.d,&local_60);
    bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
    }
  }
  uVar7 = uVar8 + 0x20000000;
  if (!bVar9) {
    uVar7 = uVar8;
  }
  QByteArray::QByteArray(&local_60,"GL_OVR_multiview2",-1);
  if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
    bVar9 = false;
  }
  else {
    pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
             findNode<QByteArray>(local_40.d,&local_60);
    bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
  }
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
    }
  }
  uVar8 = uVar7 + 0x40000000;
  if (!bVar9) {
    uVar8 = uVar7;
  }
  bVar9 = QOpenGLContext::isOpenGLES(this);
  if (bVar9) {
    iVar3 = QSurfaceFormat::majorVersion((QSurfaceFormat *)local_48);
    uVar7 = uVar8 | 2;
    if (iVar3 < 2) {
      uVar7 = uVar8;
    }
    iVar3 = QSurfaceFormat::majorVersion((QSurfaceFormat *)local_48);
    if (iVar3 < 3) {
      QByteArray::QByteArray(&local_60,"GL_OES_packed_depth_stencil",-1);
      if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar9 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_40.d,&local_60);
        bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar8 = uVar7 | 0x80;
      if (!bVar9) {
        uVar8 = uVar7;
      }
      QByteArray::QByteArray(&local_60,"GL_OES_depth24",-1);
      if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar9 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_40.d,&local_60);
        bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar7 = uVar8 | 0x10000;
      if (!bVar9) {
        uVar7 = uVar8;
      }
      QByteArray::QByteArray(&local_60,"GL_ANGLE_framebuffer_blit",-1);
      if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar9 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_40.d,&local_60);
        bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar8 = uVar7 | 0x400;
      if (!bVar9) {
        uVar8 = uVar7;
      }
      QByteArray::QByteArray(&local_60,"GL_ANGLE_framebuffer_multisample",-1);
      if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar9 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_40.d,&local_60);
        bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar7 = uVar8 | 0x10;
      if (!bVar9) {
        uVar7 = uVar8;
      }
      QByteArray::QByteArray(&local_60,"GL_NV_framebuffer_blit",-1);
      if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar9 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_40.d,&local_60);
        bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar8 = uVar7 | 0x400;
      if (!bVar9) {
        uVar8 = uVar7;
      }
      QByteArray::QByteArray(&local_60,"GL_NV_framebuffer_multisample",-1);
      if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar9 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_40.d,&local_60);
        bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar7 = uVar8 | 0x10;
      if (!bVar9) {
        uVar7 = uVar8;
      }
      QByteArray::QByteArray(&local_60,"GL_OES_rgb8_rgba8",-1);
      if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar9 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_40.d,&local_60);
        bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar8 = uVar7 | 0x200000;
      if (!bVar9) {
        uVar8 = uVar7;
      }
      QByteArray::QByteArray(&local_60,"GL_OES_compressed_ETC2_RGB8_texture",-1);
      if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar9 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_40.d,&local_60);
        bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar7 = uVar8 | 0x8000000;
      if (!bVar9) {
        uVar7 = uVar8;
      }
    }
    else {
      uVar7 = uVar7 | 0x1b718490;
    }
    QByteArray::QByteArray(&local_60,"GL_OES_mapbuffer",-1);
    if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar9 = false;
    }
    else {
      pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_40.d,&local_60);
      bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
      }
    }
    uVar8 = uVar7 | 0x40000;
    if (!bVar9) {
      uVar8 = uVar7;
    }
    QByteArray::QByteArray(&local_60,"GL_OES_element_index_uint",-1);
    if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar9 = false;
    }
    else {
      pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_40.d,&local_60);
      bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
      }
    }
    uVar7 = uVar8 | 0x8000;
    if (!bVar9) {
      uVar7 = uVar8;
    }
    QByteArray::QByteArray(&local_60,"GL_IMG_texture_format_BGRA8888",-1);
    if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar9 = false;
    }
    else {
      pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_40.d,&local_60);
      bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    bVar10 = true;
    if (!bVar9) {
      QByteArray::QByteArray(&local_90,"GL_EXT_texture_format_BGRA8888",-1);
      if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar10 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_40.d,&local_90);
        bVar10 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
    }
    if ((!bVar9) && (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0)) {
      LOCK();
      ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
      }
    }
    uVar8 = uVar7 | 0x800;
    if (!bVar10) {
      uVar8 = uVar7;
    }
    QByteArray::QByteArray(&local_60,"GL_EXT_discard_framebuffer",-1);
    if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar9 = false;
    }
    else {
      pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_40.d,&local_60);
      bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
      }
    }
    uVar1 = uVar8 | 0x400000;
    if (!bVar9) {
      uVar1 = uVar8;
    }
    QByteArray::QByteArray(&local_60,"GL_EXT_texture_norm16",-1);
    if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar9 = false;
    }
    else {
      pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_40.d,&local_60);
      bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
      }
    }
    uVar7 = uVar1 | 0x800000;
    if (!bVar9) {
      uVar7 = uVar1;
    }
  }
  else {
    pVar5 = QSurfaceFormat::version((QSurfaceFormat *)local_48);
    if (pVar5.first < 1) {
      uVar7 = 0x848000;
    }
    else {
      uVar7 = (uint)(1 < pVar5.second || pVar5.first != 1) << 0xb | 0x848000;
    }
    pVar5 = QSurfaceFormat::version((QSurfaceFormat *)local_48);
    iVar3 = pVar5.first;
    bVar9 = pVar5.second < 4;
    bVar10 = true;
    if (iVar3 < 1 || bVar9 && iVar3 == 1) {
      QByteArray::QByteArray(&local_60,"GL_SGIS_generate_mipmap",-1);
      if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar10 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_40.d,&local_60);
        bVar10 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
    }
    if ((iVar3 < 1 || bVar9 && iVar3 == 1) &&
       (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0)) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
      }
    }
    uVar1 = uVar7 | uVar8 | 2;
    if (!bVar10) {
      uVar1 = uVar7 | uVar8;
    }
    iVar3 = QSurfaceFormat::majorVersion((QSurfaceFormat *)local_48);
    uVar7 = uVar1 | 0x2000000;
    if (iVar3 < 2) {
      uVar7 = uVar1;
    }
    iVar3 = QSurfaceFormat::majorVersion((QSurfaceFormat *)local_48);
    bVar9 = true;
    if (iVar3 < 3) {
      QByteArray::QByteArray(&local_90,"GL_ARB_framebuffer_object",-1);
      if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar9 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_40.d,&local_90);
        bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
    }
    if ((iVar3 < 3) && (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0)) {
      LOCK();
      ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (bVar9) {
      uVar8 = uVar7 | 0x200490;
    }
    else {
      QByteArray::QByteArray(&local_a8,"GL_EXT_framebuffer_multisample",-1);
      if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar9 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_40.d,&local_a8);
        bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar8 = uVar7 | 0x10;
      if (!bVar9) {
        uVar8 = uVar7;
      }
      QByteArray::QByteArray(&local_a8,"GL_EXT_framebuffer_blit",-1);
      if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar9 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_40.d,&local_a8);
        bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar7 = uVar8 | 0x400;
      if (!bVar9) {
        uVar7 = uVar8;
      }
      QByteArray::QByteArray(&local_a8,"GL_EXT_packed_depth_stencil",-1);
      if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar9 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_40.d,&local_a8);
        bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar8 = uVar7 | 0x80;
      if (!bVar9) {
        uVar8 = uVar7;
      }
    }
    pVar5 = QSurfaceFormat::version((QSurfaceFormat *)local_48);
    iVar3 = pVar5.first;
    bVar9 = pVar5.second < 2;
    bVar10 = true;
    if (iVar3 < 3 || bVar9 && iVar3 == 3) {
      QByteArray::QByteArray(&local_a8,"GL_ARB_geometry_shader4",-1);
      if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar10 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_40.d,&local_a8);
        bVar10 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
    }
    if ((iVar3 < 3 || bVar9 && iVar3 == 3) &&
       (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0)) {
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,1,0x10);
      }
    }
    uVar7 = uVar8 | 0x80000;
    if (!bVar10) {
      uVar7 = uVar8;
    }
    pVar5 = QSurfaceFormat::version((QSurfaceFormat *)local_48);
    uVar8 = uVar7 | 0x1000000;
    if (pVar5.first < 3 || pVar5.second < 3 && pVar5.first == 3) {
      uVar8 = uVar7;
    }
    pVar5 = QSurfaceFormat::version((QSurfaceFormat *)local_48);
    iVar3 = pVar5.first;
    bVar9 = pVar5.second < 3;
    bVar10 = true;
    if (iVar3 < 4 || bVar9 && iVar3 == 4) {
      QByteArray::QByteArray(&local_c0,"GL_ARB_invalidate_subdata",-1);
      if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar10 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_40.d,&local_c0);
        bVar10 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
    }
    if ((iVar3 < 4 || bVar9 && iVar3 == 4) &&
       (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0)) {
      LOCK();
      ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,1,0x10);
      }
    }
    uVar7 = uVar8 | 0x400000;
    if (!bVar10) {
      uVar7 = uVar8;
    }
    QByteArray::QByteArray(&local_d8,"GL_ARB_map_buffer_range",-1);
    if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar9 = false;
    }
    else {
      pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_40.d,&local_d8);
      bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    piVar2 = (int *)CONCAT71(local_d8.d.d._1_7_,(char)local_d8.d.d);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT71(local_d8.d.d._1_7_,(char)local_d8.d.d),1,0x10)
        ;
      }
    }
    uVar8 = uVar7 | 0x100000;
    if (!bVar9) {
      uVar8 = uVar7;
    }
    QByteArray::QByteArray(&local_d8,"GL_EXT_framebuffer_sRGB",-1);
    if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar9 = false;
    }
    else {
      pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_40.d,&local_d8);
      bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    piVar2 = (int *)CONCAT71(local_d8.d.d._1_7_,(char)local_d8.d.d);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT71(local_d8.d.d._1_7_,(char)local_d8.d.d),1,0x10)
        ;
      }
    }
    if (bVar9) {
      local_d8.d.d._0_1_ = '\0';
      pQVar6 = QOpenGLContext::functions(this);
      (*(pQVar6->d_ptr->field_0).functions[0x16])(0x8dba,&local_d8);
      if ((char)local_d8.d.d != '\0') {
        uVar8 = uVar8 | 0x20000;
      }
    }
    QByteArray::QByteArray(&local_d8,"GL_ARB_ES3_compatibility",-1);
    if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar9 = false;
    }
    else {
      pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_40.d,&local_d8);
      bVar9 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    piVar2 = (int *)CONCAT71(local_d8.d.d._1_7_,(char)local_d8.d.d);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT71(local_d8.d.d._1_7_,(char)local_d8.d.d),1,0x10)
        ;
      }
    }
    uVar7 = uVar8 | 0x8000000;
    if (!bVar9) {
      uVar7 = uVar8;
    }
  }
  QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)local_48);
  QHash<QByteArray,_QHashDummyValue>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar7;
  }
  __stack_chk_fail();
}

Assistant:

static int qt_gl_resolve_extensions()
{
    int extensions = 0;
    QOpenGLExtensionMatcher extensionMatcher;
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    QSurfaceFormat format = ctx->format();

    if (extensionMatcher.match("GL_EXT_bgra"))
        extensions |= QOpenGLExtensions::BGRATextureFormat;
    if (extensionMatcher.match("GL_ARB_texture_rectangle"))
        extensions |= QOpenGLExtensions::TextureRectangle;
    if (extensionMatcher.match("GL_ARB_texture_compression"))
        extensions |= QOpenGLExtensions::TextureCompression;
    if (extensionMatcher.match("GL_EXT_texture_compression_s3tc"))
        extensions |= QOpenGLExtensions::DDSTextureCompression;
    if (extensionMatcher.match("GL_OES_compressed_ETC1_RGB8_texture"))
        extensions |= QOpenGLExtensions::ETC1TextureCompression;
    if (extensionMatcher.match("GL_IMG_texture_compression_pvrtc"))
        extensions |= QOpenGLExtensions::PVRTCTextureCompression;
    if (extensionMatcher.match("GL_KHR_texture_compression_astc_ldr"))
        extensions |= QOpenGLExtensions::ASTCTextureCompression;
    if (extensionMatcher.match("GL_ARB_texture_mirrored_repeat"))
        extensions |= QOpenGLExtensions::MirroredRepeat;
    if (extensionMatcher.match("GL_EXT_stencil_two_side"))
        extensions |= QOpenGLExtensions::StencilTwoSide;
    if (extensionMatcher.match("GL_EXT_stencil_wrap"))
        extensions |= QOpenGLExtensions::StencilWrap;
    if (extensionMatcher.match("GL_NV_float_buffer"))
        extensions |= QOpenGLExtensions::NVFloatBuffer;
    if (extensionMatcher.match("GL_ARB_pixel_buffer_object"))
        extensions |= QOpenGLExtensions::PixelBufferObject;
    if (extensionMatcher.match("GL_ARB_texture_swizzle") || extensionMatcher.match("GL_EXT_texture_swizzle"))
        extensions |= QOpenGLExtensions::TextureSwizzle;
    if (extensionMatcher.match("GL_OES_standard_derivatives"))
        extensions |= QOpenGLExtensions::StandardDerivatives;
    if (extensionMatcher.match("GL_ARB_half_float_vertex"))
        extensions |= QOpenGLExtensions::HalfFloatVertex;
    if (extensionMatcher.match("GL_OVR_multiview"))
        extensions |= QOpenGLExtensions::MultiView;
    if (extensionMatcher.match("GL_OVR_multiview2"))
        extensions |= QOpenGLExtensions::MultiViewExtended;

    if (ctx->isOpenGLES()) {
        if (format.majorVersion() >= 2)
            extensions |= QOpenGLExtensions::GenerateMipmap;

        if (format.majorVersion() >= 3) {
            extensions |= QOpenGLExtensions::PackedDepthStencil
                | QOpenGLExtensions::Depth24
                | QOpenGLExtensions::ElementIndexUint
                | QOpenGLExtensions::MapBufferRange
                | QOpenGLExtensions::FramebufferBlit
                | QOpenGLExtensions::FramebufferMultisample
                | QOpenGLExtensions::Sized8Formats
                | QOpenGLExtensions::DiscardFramebuffer
                | QOpenGLExtensions::StandardDerivatives
                | QOpenGLExtensions::ETC2TextureCompression
                | QOpenGLExtensions::HalfFloatVertex;
#ifndef Q_OS_WASM
            // WebGL 2.0 specification explicitly does not support texture swizzles
            // https://registry.khronos.org/webgl/specs/latest/2.0/#5.19
            extensions |= QOpenGLExtensions::TextureSwizzle;
#endif
        } else {
            // Recognize features by extension name.
            if (extensionMatcher.match("GL_OES_packed_depth_stencil"))
                extensions |= QOpenGLExtensions::PackedDepthStencil;
            if (extensionMatcher.match("GL_OES_depth24"))
                extensions |= QOpenGLExtensions::Depth24;
            if (extensionMatcher.match("GL_ANGLE_framebuffer_blit"))
                extensions |= QOpenGLExtensions::FramebufferBlit;
            if (extensionMatcher.match("GL_ANGLE_framebuffer_multisample"))
                extensions |= QOpenGLExtensions::FramebufferMultisample;
            if (extensionMatcher.match("GL_NV_framebuffer_blit"))
                extensions |= QOpenGLExtensions::FramebufferBlit;
            if (extensionMatcher.match("GL_NV_framebuffer_multisample"))
                extensions |= QOpenGLExtensions::FramebufferMultisample;
            if (extensionMatcher.match("GL_OES_rgb8_rgba8"))
                extensions |= QOpenGLExtensions::Sized8Formats;
            if (extensionMatcher.match("GL_OES_compressed_ETC2_RGB8_texture"))
                extensions |= QOpenGLExtensions::ETC2TextureCompression;
        }

        if (extensionMatcher.match("GL_OES_mapbuffer"))
            extensions |= QOpenGLExtensions::MapBuffer;
        if (extensionMatcher.match("GL_OES_element_index_uint"))
            extensions |= QOpenGLExtensions::ElementIndexUint;
        // We don't match GL_APPLE_texture_format_BGRA8888 here because it has different semantics.
        if (extensionMatcher.match("GL_IMG_texture_format_BGRA8888") || extensionMatcher.match("GL_EXT_texture_format_BGRA8888"))
            extensions |= QOpenGLExtensions::BGRATextureFormat;
#ifdef Q_OS_ANDROID
        QString *deviceName =
                static_cast<QString *>(QGuiApplication::platformNativeInterface()->nativeResourceForIntegration("AndroidDeviceName"));
        static bool wrongfullyReportsBgra8888Support = deviceName != 0
                                                        && (deviceName->compare("samsung SM-T211"_L1, Qt::CaseInsensitive) == 0
                                                            || deviceName->compare("samsung SM-T210"_L1, Qt::CaseInsensitive) == 0
                                                            || deviceName->compare("samsung SM-T215"_L1, Qt::CaseInsensitive) == 0);
        if (wrongfullyReportsBgra8888Support)
            extensions &= ~QOpenGLExtensions::BGRATextureFormat;
#endif

        if (extensionMatcher.match("GL_EXT_discard_framebuffer"))
            extensions |= QOpenGLExtensions::DiscardFramebuffer;
        if (extensionMatcher.match("GL_EXT_texture_norm16"))
            extensions |= QOpenGLExtensions::Sized16Formats;
    } else {
        extensions |= QOpenGLExtensions::ElementIndexUint
            | QOpenGLExtensions::MapBuffer
            | QOpenGLExtensions::Sized16Formats;

        if (format.version() >= std::pair(1, 2))
            extensions |= QOpenGLExtensions::BGRATextureFormat;

        if (format.version() >= std::pair(1, 4) || extensionMatcher.match("GL_SGIS_generate_mipmap"))
            extensions |= QOpenGLExtensions::GenerateMipmap;

        if (format.majorVersion() >= 2)
            extensions |= QOpenGLExtensions::StandardDerivatives;

        if (format.majorVersion() >= 3 || extensionMatcher.match("GL_ARB_framebuffer_object")) {
            extensions |= QOpenGLExtensions::FramebufferMultisample
                | QOpenGLExtensions::FramebufferBlit
                | QOpenGLExtensions::PackedDepthStencil
                | QOpenGLExtensions::Sized8Formats;
        } else {
            // Recognize features by extension name.
            if (extensionMatcher.match("GL_EXT_framebuffer_multisample"))
                extensions |= QOpenGLExtensions::FramebufferMultisample;
            if (extensionMatcher.match("GL_EXT_framebuffer_blit"))
                extensions |= QOpenGLExtensions::FramebufferBlit;
            if (extensionMatcher.match("GL_EXT_packed_depth_stencil"))
                extensions |= QOpenGLExtensions::PackedDepthStencil;
        }

        if (format.version() >= std::pair(3, 2) || extensionMatcher.match("GL_ARB_geometry_shader4"))
            extensions |= QOpenGLExtensions::GeometryShaders;

        if (format.version() >= std::pair(3, 3))
            extensions |= QOpenGLExtensions::TextureSwizzle;

        if (format.version() >= std::pair(4, 3) || extensionMatcher.match("GL_ARB_invalidate_subdata"))
            extensions |= QOpenGLExtensions::DiscardFramebuffer;

        if (extensionMatcher.match("GL_ARB_map_buffer_range"))
            extensions |= QOpenGLExtensions::MapBufferRange;

        if (extensionMatcher.match("GL_EXT_framebuffer_sRGB")) {
            GLboolean srgbCapableFramebuffers = false;
            ctx->functions()->glGetBooleanv(GL_FRAMEBUFFER_SRGB_CAPABLE_EXT, &srgbCapableFramebuffers);
            if (srgbCapableFramebuffers)
                extensions |= QOpenGLExtensions::SRGBFrameBuffer;
        }

        if (extensionMatcher.match("GL_ARB_ES3_compatibility"))
            extensions |= QOpenGLExtensions::ETC2TextureCompression;
    }

    return extensions;
}